

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall
glslang::TIntermediate::setShiftBindingForSet
          (TIntermediate *this,TResourceType res,uint shift,uint set)

{
  reference this_00;
  uint *puVar1;
  char *process;
  char *name;
  uint local_18;
  uint set_local;
  uint shift_local;
  TResourceType res_local;
  TIntermediate *this_local;
  
  if (shift != 0) {
    name._4_4_ = set;
    local_18 = shift;
    set_local = res;
    _shift_local = this;
    this_00 = std::
              array<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_6UL>
              ::operator[](&this->shiftBindingForSet,(ulong)res);
    name._0_4_ = name._4_4_;
    puVar1 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](this_00,(key_type_conflict1 *)&name);
    *puVar1 = shift;
    process = getResourceName(set_local);
    if (process != (char *)0x0) {
      TProcesses::addProcess(&this->processes,process);
      TProcesses::addArgument(&this->processes,local_18);
      TProcesses::addArgument(&this->processes,name._4_4_);
    }
  }
  return;
}

Assistant:

void setShiftBindingForSet(TResourceType res, unsigned int shift, unsigned int set)
    {
        if (shift == 0) // ignore if there's no shift: it's a no-op.
            return;

        shiftBindingForSet[res][set] = shift;

        const char* name = getResourceName(res);
        if (name != nullptr) {
            processes.addProcess(name);
            processes.addArgument(shift);
            processes.addArgument(set);
        }
    }